

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_send_pong_frame_payload_too_large(void)

{
  cio_error cVar1;
  cio_write_buffer wb;
  cio_write_buffer wbh;
  char buffer [126];
  cio_write_buffer local_d8;
  cio_write_buffer local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined6 uStack_30;
  undefined2 local_2a;
  undefined6 uStack_28;
  undefined8 uStack_22;
  
  uStack_90 = 0;
  uStack_28 = 0;
  uStack_22 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  local_2a = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0x61;
  local_b8.next = &local_d8;
  local_d8.data.element.length = 0x7e;
  local_b8.data.head.q_len = 1;
  local_b8.data.element.length = 0x7e;
  local_d8.next = &local_b8;
  local_d8.prev = &local_b8;
  local_d8.data.head.q_len = (size_t)&local_98;
  local_b8.prev = local_b8.next;
  cVar1 = cio_websocket_write_pong(ws,&local_b8,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (-0x16,(long)cVar1,"Writing a pong frame did not succeed!",0x9a8,UNITY_DISPLAY_STYLE_INT
            );
  UnityAssertEqualNumber
            (0,(ulong)write_handler_fake.call_count,"Write handler was called",0x9a9,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)on_error_fake.call_count,"error callback was called",0x9ab,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,local_b8.data.head.q_len,"Length of write buffer different than before writing!",
             0x9ad,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&local_b8,(UNITY_INT)(local_b8.next)->next,
             "Concatenation of write buffers no longer correct after writing!",0x9ae,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualMemory
            (&local_98,((local_b8.next)->data).element.field_0.const_data,0x7e,1,
             "Content of writebuffer not correct after writing!",0x9af,UNITY_ARRAY_TO_ARRAY);
  return;
}

Assistant:

static void test_send_pong_frame_payload_too_large(void)
{
	char buffer[126] = {'a'};

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, buffer, sizeof(buffer));
	cio_write_buffer_queue_tail(&wbh, &wb);

	enum cio_error err = cio_websocket_write_pong(ws, &wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "Writing a pong frame did not succeed!");
	TEST_ASSERT_EQUAL_MESSAGE(0, write_handler_fake.call_count, "Write handler was called");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Length of write buffer different than before writing!");
	TEST_ASSERT_EQUAL_MESSAGE(&wbh, wbh.next->next, "Concatenation of write buffers no longer correct after writing!");
	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(buffer, wbh.next->data.element.data, sizeof(buffer), "Content of writebuffer not correct after writing!");
}